

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_writer_init_file
                  (mz_zip_archive *pZip,char *pFilename,mz_uint64 size_to_reserve_at_beginning)

{
  mz_bool mVar1;
  FILE *pFVar2;
  ulong uVar3;
  ulong in_RDX;
  char *in_RSI;
  long in_RDI;
  size_t n;
  char buf [4096];
  mz_uint64 cur_ofs;
  FILE *pFile;
  mz_zip_archive *in_stack_ffffffffffffefb8;
  ulong uVar4;
  mz_zip_archive *in_stack_ffffffffffffefc8;
  long local_30;
  ulong local_20;
  mz_bool local_4;
  
  *(code **)(in_RDI + 0x48) = mz_zip_file_write_func;
  *(long *)(in_RDI + 0x50) = in_RDI;
  mVar1 = mz_zip_writer_init(in_stack_ffffffffffffefb8,0x16575b);
  if (mVar1 == 0) {
    local_4 = 0;
  }
  else {
    pFVar2 = fopen64(in_RSI,"wb");
    if (pFVar2 == (FILE *)0x0) {
      mz_zip_writer_end(in_stack_ffffffffffffefc8);
      local_4 = 0;
    }
    else {
      *(FILE **)(*(long *)(in_RDI + 0x58) + 0x60) = pFVar2;
      if (in_RDX != 0) {
        local_30 = 0;
        memset(&stack0xffffffffffffefc8,0,0x1000);
        local_20 = in_RDX;
        do {
          uVar4 = local_20;
          if (0x1000 < local_20) {
            uVar4 = 0x1000;
          }
          uVar3 = (**(code **)(in_RDI + 0x48))
                            (*(undefined8 *)(in_RDI + 0x50),local_30,&stack0xffffffffffffefc8,uVar4)
          ;
          if (uVar3 != uVar4) {
            mz_zip_writer_end(in_stack_ffffffffffffefc8);
            return 0;
          }
          local_30 = uVar4 + local_30;
          local_20 = local_20 - uVar4;
        } while (local_20 != 0);
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

mz_bool mz_zip_writer_init_file(mz_zip_archive *pZip, const char *pFilename, mz_uint64 size_to_reserve_at_beginning)
{
  MZ_FILE *pFile;
  pZip->m_pWrite = mz_zip_file_write_func;
  pZip->m_pIO_opaque = pZip;
  if (!mz_zip_writer_init(pZip, size_to_reserve_at_beginning))
    return MZ_FALSE;
  if (NULL == (pFile = MZ_FOPEN(pFilename, "wb")))
  {
    mz_zip_writer_end(pZip);
    return MZ_FALSE;
  }
  pZip->m_pState->m_pFile = pFile;
  if (size_to_reserve_at_beginning)
  {
    mz_uint64 cur_ofs = 0; char buf[4096]; MZ_CLEAR_OBJ(buf);
    do
    {
      size_t n = (size_t)MZ_MIN(sizeof(buf), size_to_reserve_at_beginning);
      if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_ofs, buf, n) != n)
      {
        mz_zip_writer_end(pZip);
        return MZ_FALSE;
      }
      cur_ofs += n; size_to_reserve_at_beginning -= n;
    } while (size_to_reserve_at_beginning);
  }
  return MZ_TRUE;
}